

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

int32_t __thiscall
icu_63::MessagePattern::parseSimpleStyle
          (MessagePattern *this,int32_t index,UParseError *parseError,UErrorCode *errorCode)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t length;
  UChar c;
  int32_t nestedBraces;
  int32_t start;
  UErrorCode *errorCode_local;
  UParseError *parseError_local;
  int32_t index_local;
  MessagePattern *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    length = 0;
    iVar3 = index;
    while (parseError_local._4_4_ = iVar3, iVar3 = UnicodeString::length(&this->msg),
          parseError_local._4_4_ < iVar3) {
      iVar3 = parseError_local._4_4_ + 1;
      cVar2 = UnicodeString::charAt(&this->msg,parseError_local._4_4_);
      if (cVar2 == L'\'') {
        iVar3 = UnicodeString::indexOf(&this->msg,L'\'',iVar3);
        if (iVar3 < 0) {
          setParseError(this,parseError,index);
          *errorCode = U_PATTERN_SYNTAX_ERROR;
          return 0;
        }
        iVar3 = iVar3 + 1;
      }
      else if (cVar2 == L'{') {
        length = length + 1;
      }
      else if (cVar2 == L'}') {
        if (length < 1) {
          if (parseError_local._4_4_ - index < 0x10000) {
            addPart(this,UMSGPAT_PART_TYPE_ARG_STYLE,index,parseError_local._4_4_ - index,0,
                    errorCode);
            return parseError_local._4_4_;
          }
          setParseError(this,parseError,index);
          *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          return 0;
        }
        length = length + -1;
      }
    }
    setParseError(this,parseError,0);
    *errorCode = U_UNMATCHED_BRACES;
  }
  return 0;
}

Assistant:

int32_t
MessagePattern::parseSimpleStyle(int32_t index, UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t start=index;
    int32_t nestedBraces=0;
    while(index<msg.length()) {
        UChar c=msg.charAt(index++);
        if(c==u_apos) {
            // Treat apostrophe as quoting but include it in the style part.
            // Find the end of the quoted literal text.
            index=msg.indexOf(u_apos, index);
            if(index<0) {
                // Quoted literal argument style text reaches to the end of the message.
                setParseError(parseError, start);
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            // skip the quote-ending apostrophe
            ++index;
        } else if(c==u_leftCurlyBrace) {
            ++nestedBraces;
        } else if(c==u_rightCurlyBrace) {
            if(nestedBraces>0) {
                --nestedBraces;
            } else {
                int32_t length=--index-start;
                if(length>Part::MAX_LENGTH) {
                    setParseError(parseError, start);  // Argument style text too long.
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
                addPart(UMSGPAT_PART_TYPE_ARG_STYLE, start, length, 0, errorCode);
                return index;
            }
        }  // c is part of literal text
    }
    setParseError(parseError, 0);  // Unmatched '{' braces in message.
    errorCode=U_UNMATCHED_BRACES;
    return 0;
}